

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TType::TType(TType *this,TTypeList *userDef,TString *n)

{
  undefined1 *puVar1;
  char *__s;
  TPoolAllocator *this_00;
  TString *this_01;
  pool_allocator<char> local_20;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00af5e70;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf0000000 | 0x10f;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = userDef;
  this->fieldName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  this->sampler = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
  puVar1 = &(this->qualifier).field_0xb;
  *puVar1 = *puVar1 & 0xe1;
  TQualifier::makeTemporary(&this->qualifier);
  puVar1 = &(this->qualifier).field_0x8;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xe3ffffe7fe00ffff;
  __s = (n->_M_dataplus)._M_p;
  this_00 = GetThreadPoolAllocator();
  this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
  local_20.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,__s,
             &local_20);
  this->typeName = this_01;
  return;
}

Assistant:

TType(TTypeList* userDef, const TString& n) :
                            basicType(EbtStruct), vectorSize(1), matrixCols(0), matrixRows(0), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
                            arraySizes(nullptr), structure(userDef), fieldName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                sampler.clear();
                                qualifier.clear();
                                typeName = NewPoolTString(n.c_str());
                            }